

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

Status __thiscall util::fs::FileLock::acquire(FileLock *this,string *filename)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  int *piVar4;
  undefined1 local_240 [8];
  ofstream touch;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *filename_local;
  FileLock *this_local;
  
  local_20 = filename;
  filename_local = &this->lockfile;
  std::operator+(local_40,(char *)filename);
  std::__cxx11::string::operator=((string *)this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::clear();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  bVar1 = file_exists(pcVar3);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->reason,"Previous lock existing");
    this_local._4_4_ = LOCK_EXISTS;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_240,pcVar3,_S_bin);
    bVar2 = std::ios::good();
    if ((bVar2 & 1) == 0) {
      std::__cxx11::string::operator=((string *)&this->reason,"Error locking: ");
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      std::__cxx11::string::operator+=((string *)&this->reason,pcVar3);
      this_local._4_4_ = LOCK_CREATE_ERROR;
    }
    else {
      std::ofstream::close();
      this_local._4_4_ = LOCK_CREATED;
    }
    std::ofstream::~ofstream(local_240);
  }
  return this_local._4_4_;
}

Assistant:

FileLock::Status
FileLock::acquire (std::string const& filename)
{
    /* Check if lock file exists. */
    this->lockfile = filename + ".lock";
    this->reason.clear();
    if (fs::file_exists(this->lockfile.c_str()))
    {
        this->reason = "Previous lock existing";
        return FileLock::LOCK_EXISTS;
    }

    /* Finally create the lock file. */
    std::ofstream touch(this->lockfile.c_str(), std::ios::binary);
    if (!touch.good())
    {
        this->reason = "Error locking: ";
        this->reason += std::strerror(errno);
        return FileLock::LOCK_CREATE_ERROR;
    }
    touch.close();

    /* Return success, lock is created. */
    return FileLock::LOCK_CREATED;
}